

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_QName(void)

{
  byte bVar1;
  int iVar2;
  Status SVar3;
  XMLCh *pXVar4;
  char *pcVar5;
  XSValue *pXVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  void *pvVar10;
  bool bVar11;
  StrX local_4e0;
  StrX local_4d0;
  StrX local_4c0;
  long local_4b0;
  XMLCh *actRetCanRep_5;
  undefined1 local_4a0 [4];
  Status myStatus_17;
  StrX local_490;
  StrX local_480;
  long local_470;
  XMLCh *actRetCanRep_4;
  undefined1 local_460 [4];
  Status myStatus_16;
  StrX local_450;
  StrX local_440;
  long local_430;
  XMLCh *actRetCanRep_3;
  undefined1 local_420 [4];
  Status myStatus_15;
  StrX local_410;
  StrX local_400;
  long local_3f0;
  XMLCh *actRetCanRep_2;
  undefined1 local_3e0 [4];
  Status myStatus_14;
  StrX local_3d0;
  StrX local_3c0;
  long local_3b0;
  XMLCh *actRetCanRep_1;
  undefined1 local_3a0 [4];
  Status myStatus_13;
  StrX local_390;
  StrX local_380;
  long local_370;
  XMLCh *actRetCanRep;
  Status myStatus_12;
  int j;
  StrX local_350;
  StrX local_340;
  XSValue *local_330;
  XSValue *actRetValue_5;
  undefined1 local_320 [4];
  Status myStatus_11;
  StrX local_310;
  StrX local_300;
  XSValue *local_2f0;
  XSValue *actRetValue_4;
  undefined1 local_2e0 [4];
  Status myStatus_10;
  StrX local_2d0;
  StrX local_2c0;
  XSValue *local_2b0;
  XSValue *actRetValue_3;
  undefined1 local_2a0 [4];
  Status myStatus_9;
  StrX local_290;
  StrX local_280;
  XSValue *local_270;
  XSValue *actRetValue_2;
  undefined1 local_260 [4];
  Status myStatus_8;
  StrX local_250;
  StrX local_240;
  XSValue *local_230;
  XSValue *actRetValue_1;
  undefined1 local_220 [4];
  Status myStatus_7;
  StrX local_210;
  StrX local_200;
  XSValue *local_1f0;
  XSValue *actRetValue;
  Status myStatus_6;
  int i;
  StrX local_1d0;
  byte local_1bd;
  Status local_1bc;
  undefined1 local_1b8 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_1a8;
  byte local_195;
  Status local_194;
  undefined1 local_190 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_180;
  byte local_16d;
  Status local_16c;
  undefined1 local_168 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_158;
  byte local_145;
  Status local_144;
  undefined1 local_140 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_130;
  byte local_11d;
  Status local_11c;
  undefined1 local_118 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_f8;
  byte local_e1;
  Status local_e0;
  char acStack_dc [3];
  bool actRetValid;
  Status myStatus;
  char iv_3 [6];
  char iv_2 [4];
  char iv_1 [14];
  XSValue_Data act_v_ran_v_3;
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  char v_3 [12];
  char v_2 [15];
  char cStack_21;
  char v_1 [16];
  bool toValidate;
  DataType dt;
  
  builtin_strncpy(v_2 + 8,"   Ant:",7);
  cStack_21 = 'E';
  builtin_strncpy(v_2,"Length",7);
  stack0xffffffffffffffc8 = 0x6d756d696e694d;
  act_v_ran_v_1.fValue.f_datetime.f_milisec = 5.112208813763299e-66;
  v_3[0] = '3';
  v_3[1] = '4';
  v_3[2] = '5';
  v_3[3] = '\0';
  act_v_ran_v_1.f_datatype = dt_string;
  act_v_ran_v_1._4_4_ = 0;
  stack0xffffffffffffff30 = 0x3a6565726854;
  iv_3[0] = ':';
  iv_3[1] = 'm';
  iv_3[2] = 'y';
  iv_3[3] = '\0';
  myStatus._0_2_ = 0x65;
  _acStack_dc = 0x6d616e2b;
  local_e0 = st_Init;
  StrX::StrX(&local_f8,v_2 + 8);
  pXVar4 = StrX::unicodeForm(&local_f8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_QName,&local_e0,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_f8);
  local_e1 = bVar1 & 1;
  if (local_e1 != 1) {
    pXVar4 = getDataTypeString(dt_QName);
    StrX::StrX((StrX *)local_118,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_118);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1401,v_2 + 8,pcVar5,1);
    StrX::~StrX((StrX *)local_118);
    errSeen = true;
  }
  local_11c = st_Init;
  StrX::StrX(&local_130,v_3 + 8);
  pXVar4 = StrX::unicodeForm(&local_130);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_QName,&local_11c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_130);
  local_11d = bVar1 & 1;
  if (local_11d != 1) {
    pXVar4 = getDataTypeString(dt_QName);
    StrX::StrX((StrX *)local_140,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_140);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1402,v_3 + 8,pcVar5,1);
    StrX::~StrX((StrX *)local_140);
    errSeen = true;
  }
  local_144 = st_Init;
  StrX::StrX(&local_158,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
  pXVar4 = StrX::unicodeForm(&local_158);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_QName,&local_144,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_158);
  local_145 = bVar1 & 1;
  if (local_145 != 1) {
    pXVar4 = getDataTypeString(dt_QName);
    StrX::StrX((StrX *)local_168,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_168);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1403,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,1);
    StrX::~StrX((StrX *)local_168);
    errSeen = true;
  }
  local_16c = st_Init;
  StrX::StrX(&local_180,iv_3 + 4);
  pXVar4 = StrX::unicodeForm(&local_180);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_QName,&local_16c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_180);
  local_16d = bVar1 & 1;
  if (local_16d != 0) {
    pXVar4 = getDataTypeString(dt_QName);
    StrX::StrX((StrX *)local_190,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_190);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1406,iv_3 + 4,pcVar5,0);
    StrX::~StrX((StrX *)local_190);
    errSeen = true;
  }
  local_194 = st_Init;
  StrX::StrX(&local_1a8,iv_3);
  pXVar4 = StrX::unicodeForm(&local_1a8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_QName,&local_194,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1a8);
  local_195 = bVar1 & 1;
  if (local_195 != 0) {
    pXVar4 = getDataTypeString(dt_QName);
    StrX::StrX((StrX *)local_1b8,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_1b8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1407,iv_3,pcVar5,0);
    StrX::~StrX((StrX *)local_1b8);
    errSeen = true;
  }
  local_1bc = st_Init;
  StrX::StrX(&local_1d0,acStack_dc);
  pXVar4 = StrX::unicodeForm(&local_1d0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_QName,&local_1bc,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1d0);
  local_1bd = bVar1 & 1;
  if (local_1bd != 0) {
    pXVar4 = getDataTypeString(dt_QName);
    StrX::StrX((StrX *)&myStatus_6,pXVar4);
    pcVar5 = StrX::localForm((StrX *)&myStatus_6);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1408,acStack_dc,pcVar5,0);
    StrX::~StrX((StrX *)&myStatus_6);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = st_Init;
    StrX::StrX(&local_200,v_2 + 8);
    pXVar4 = StrX::unicodeForm(&local_200);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_QName,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_200);
    local_1f0 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if ((Status)actRetValue != st_NoActVal) {
        pXVar4 = getDataTypeString(dt_QName);
        StrX::StrX((StrX *)local_220,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_220);
        pcVar7 = getStatusString(st_NoActVal);
        pcVar8 = getStatusString((Status)actRetValue);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1422,v_2 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_220);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_QName);
      StrX::StrX(&local_210,pXVar4);
      StrX::localForm(&local_210);
      pvVar10 = (void *)0x1422;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1422,v_2 + 8);
      StrX::~StrX(&local_210);
      pXVar6 = local_1f0;
      errSeen = true;
      if (local_1f0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_1f0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_1._4_4_ = st_Init;
    StrX::StrX(&local_240,v_3 + 8);
    pXVar4 = StrX::unicodeForm(&local_240);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_QName,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_240);
    local_230 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_1._4_4_ != st_NoActVal) {
        pXVar4 = getDataTypeString(dt_QName);
        StrX::StrX((StrX *)local_260,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_260);
        pcVar7 = getStatusString(st_NoActVal);
        pcVar8 = getStatusString(actRetValue_1._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1423,v_3 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_260);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_QName);
      StrX::StrX(&local_250,pXVar4);
      StrX::localForm(&local_250);
      pvVar10 = (void *)0x1423;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1423,v_3 + 8);
      StrX::~StrX(&local_250);
      pXVar6 = local_230;
      errSeen = true;
      if (local_230 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_230);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_2._4_4_ = st_Init;
    StrX::StrX(&local_280,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar4 = StrX::unicodeForm(&local_280);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_QName,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_280);
    local_270 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_2._4_4_ != st_NoActVal) {
        pXVar4 = getDataTypeString(dt_QName);
        StrX::StrX((StrX *)local_2a0,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_2a0);
        pcVar7 = getStatusString(st_NoActVal);
        pcVar8 = getStatusString(actRetValue_2._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1424,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_2a0);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_QName);
      StrX::StrX(&local_290,pXVar4);
      StrX::localForm(&local_290);
      pvVar10 = (void *)0x1424;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1424,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_290);
      pXVar6 = local_270;
      errSeen = true;
      if (local_270 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_270);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_2c0,iv_3 + 4);
    pXVar4 = StrX::unicodeForm(&local_2c0);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_QName,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_2c0);
    local_2b0 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      iVar2 = 3;
      if (bVar11) {
        iVar2 = 6;
      }
      if (iVar2 != 10) {
        SVar3 = st_NoActVal;
        if (bVar11) {
          SVar3 = st_FOCA0002;
        }
        if (SVar3 != actRetValue_3._4_4_) {
          pXVar4 = getDataTypeString(dt_QName);
          StrX::StrX((StrX *)local_2e0,pXVar4);
          pcVar5 = StrX::localForm((StrX *)local_2e0);
          pcVar7 = getStatusString((uint)bVar11 * 3 + st_NoActVal);
          pcVar8 = getStatusString(actRetValue_3._4_4_);
          printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
                 ,0x1428,iv_3 + 4,pcVar5,pcVar7,pcVar8);
          StrX::~StrX((StrX *)local_2e0);
          errSeen = true;
        }
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_QName);
      StrX::StrX(&local_2d0,pXVar4);
      StrX::localForm(&local_2d0);
      pvVar10 = (void *)0x1428;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1428,iv_3 + 4);
      StrX::~StrX(&local_2d0);
      pXVar6 = local_2b0;
      errSeen = true;
      if (local_2b0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_2b0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_300,iv_3);
    pXVar4 = StrX::unicodeForm(&local_300);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_QName,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_300);
    local_2f0 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      iVar2 = 3;
      if (bVar11) {
        iVar2 = 6;
      }
      if (iVar2 != 10) {
        SVar3 = st_NoActVal;
        if (bVar11) {
          SVar3 = st_FOCA0002;
        }
        if (SVar3 != actRetValue_4._4_4_) {
          pXVar4 = getDataTypeString(dt_QName);
          StrX::StrX((StrX *)local_320,pXVar4);
          pcVar5 = StrX::localForm((StrX *)local_320);
          pcVar7 = getStatusString((uint)bVar11 * 3 + st_NoActVal);
          pcVar8 = getStatusString(actRetValue_4._4_4_);
          printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
                 ,0x142a,iv_3,pcVar5,pcVar7,pcVar8);
          StrX::~StrX((StrX *)local_320);
          errSeen = true;
        }
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_QName);
      StrX::StrX(&local_310,pXVar4);
      StrX::localForm(&local_310);
      pvVar10 = (void *)0x142a;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x142a,iv_3);
      StrX::~StrX(&local_310);
      pXVar6 = local_2f0;
      errSeen = true;
      if (local_2f0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_2f0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_5._4_4_ = st_Init;
    StrX::StrX(&local_340,acStack_dc);
    pXVar4 = StrX::unicodeForm(&local_340);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_QName,(Status *)((long)&actRetValue_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_340);
    local_330 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      iVar2 = 3;
      if (bVar11) {
        iVar2 = 6;
      }
      if (iVar2 != 10) {
        SVar3 = st_NoActVal;
        if (bVar11) {
          SVar3 = st_FOCA0002;
        }
        if (SVar3 != actRetValue_5._4_4_) {
          pXVar4 = getDataTypeString(dt_QName);
          StrX::StrX((StrX *)&myStatus_12,pXVar4);
          pcVar5 = StrX::localForm((StrX *)&myStatus_12);
          pcVar7 = getStatusString((uint)bVar11 * 3 + st_NoActVal);
          pcVar8 = getStatusString(actRetValue_5._4_4_);
          printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
                 ,0x142c,acStack_dc,pcVar5,pcVar7,pcVar8);
          StrX::~StrX((StrX *)&myStatus_12);
          errSeen = true;
        }
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_QName);
      StrX::StrX(&local_350,pXVar4);
      StrX::localForm(&local_350);
      pvVar10 = (void *)0x142c;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x142c,acStack_dc);
      StrX::~StrX(&local_350);
      pXVar6 = local_330;
      errSeen = true;
      if (local_330 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_330);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = st_Init;
    StrX::StrX(&local_380,v_2 + 8);
    pXVar4 = StrX::unicodeForm(&local_380);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_QName,(Status *)&actRetCanRep,ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_380);
    local_370 = lVar9;
    if (lVar9 == 0) {
      if ((Status)actRetCanRep != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_QName);
        StrX::StrX((StrX *)local_3a0,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_3a0);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString((Status)actRetCanRep);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1449,v_2 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_3a0);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_QName);
      StrX::StrX(&local_390,pXVar4);
      StrX::localForm(&local_390);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1449,v_2 + 8);
      StrX::~StrX(&local_390);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_370);
      errSeen = true;
    }
    actRetCanRep_1._4_4_ = st_Init;
    StrX::StrX(&local_3c0,v_3 + 8);
    pXVar4 = StrX::unicodeForm(&local_3c0);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_QName,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_3c0);
    local_3b0 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_1._4_4_ != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_QName);
        StrX::StrX((StrX *)local_3e0,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_3e0);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_1._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x144a,v_3 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_3e0);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_QName);
      StrX::StrX(&local_3d0,pXVar4);
      StrX::localForm(&local_3d0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x144a,v_3 + 8);
      StrX::~StrX(&local_3d0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_3b0);
      errSeen = true;
    }
    actRetCanRep_2._4_4_ = st_Init;
    StrX::StrX(&local_400,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar4 = StrX::unicodeForm(&local_400);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_QName,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_400);
    local_3f0 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_2._4_4_ != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_QName);
        StrX::StrX((StrX *)local_420,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_420);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_2._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x144b,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_420);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_QName);
      StrX::StrX(&local_410,pXVar4);
      StrX::localForm(&local_410);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x144b,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_410);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_3f0);
      errSeen = true;
    }
    actRetCanRep_3._4_4_ = st_Init;
    StrX::StrX(&local_440,iv_3 + 4);
    pXVar4 = StrX::unicodeForm(&local_440);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_QName,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_440);
    local_430 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_3._4_4_) {
        pXVar4 = getDataTypeString(dt_QName);
        StrX::StrX((StrX *)local_460,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_460);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_3._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x144f,iv_3 + 4,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_460);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_QName);
      StrX::StrX(&local_450,pXVar4);
      StrX::localForm(&local_450);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x144f,iv_3 + 4);
      StrX::~StrX(&local_450);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_430);
      errSeen = true;
    }
    actRetCanRep_4._4_4_ = st_Init;
    StrX::StrX(&local_480,iv_3);
    pXVar4 = StrX::unicodeForm(&local_480);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_QName,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_480);
    local_470 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_4._4_4_) {
        pXVar4 = getDataTypeString(dt_QName);
        StrX::StrX((StrX *)local_4a0,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_4a0);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_4._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1451,iv_3,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_4a0);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_QName);
      StrX::StrX(&local_490,pXVar4);
      StrX::localForm(&local_490);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1451,iv_3);
      StrX::~StrX(&local_490);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_470);
      errSeen = true;
    }
    actRetCanRep_5._4_4_ = st_Init;
    StrX::StrX(&local_4c0,acStack_dc);
    pXVar4 = StrX::unicodeForm(&local_4c0);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_QName,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_4c0);
    local_4b0 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_5._4_4_) {
        pXVar4 = getDataTypeString(dt_QName);
        StrX::StrX(&local_4e0,pXVar4);
        pcVar5 = StrX::localForm(&local_4e0);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_5._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1453,acStack_dc,pcVar5,pcVar7,pcVar8);
        StrX::~StrX(&local_4e0);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_QName);
      StrX::StrX(&local_4d0,pXVar4);
      StrX::localForm(&local_4d0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1453,acStack_dc);
      StrX::~StrX(&local_4d0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_4b0);
      errSeen = true;
    }
  }
  return;
}

Assistant:

void test_dt_QName()
{
    const XSValue::DataType dt = XSValue::dt_QName;
    bool  toValidate = true;

    const char v_1[]="   Ant:Eater  \n";
    const char v_2[]="Minimum_Length";
    const char v_3[]="abcde:a2345";

    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_3;  act_v_ran_v_3.fValue.f_strVal = 0;

    const char iv_1[]="Three:Two:One";
    const char iv_2[]=":my";
    const char iv_3[]="+name";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE,  DONT_CARE);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_NoActVal
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_2,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_3,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoActVal), act_v_ran_v_1);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
    }

}